

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::DoSimplePolygons(Clipper *this)

{
  bool bVar1;
  OutRec *OldOutRec;
  int iVar2;
  long lVar3;
  OutRec *NewOutRec;
  OutPt *op;
  OutPt *pOVar4;
  OutRec *OuterOutRec;
  ulong uVar5;
  OutPt *op_1;
  OutPt *pOVar6;
  OutPt *pOVar7;
  byte unaff_R12B;
  byte bVar8;
  OutPt *op_00;
  
  lVar3 = *(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]);
  if (*(long *)(this->_vptr_Clipper[-3] +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) !=
      lVar3) {
    uVar5 = 0;
    do {
      OldOutRec = *(OutRec **)(lVar3 + uVar5 * 8);
      pOVar7 = OldOutRec->Pts;
      if ((pOVar7 != (OutPt *)0x0) && (OldOutRec->IsOpen == false)) {
        do {
          op_00 = pOVar7->Next;
LAB_0010dbc1:
          if (op_00 != OldOutRec->Pts) {
            if (((((pOVar7->Pt).X == (op_00->Pt).X) && ((pOVar7->Pt).Y == (op_00->Pt).Y)) &&
                (op_00->Next != pOVar7)) && (pOVar4 = op_00->Prev, pOVar4 != pOVar7)) {
              pOVar6 = pOVar7->Prev;
              pOVar7->Prev = pOVar4;
              pOVar4->Next = pOVar7;
              op_00->Prev = pOVar6;
              pOVar6->Next = op_00;
              OldOutRec->Pts = pOVar7;
              NewOutRec = ClipperBase::CreateOutRec
                                    ((ClipperBase *)
                                     ((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]));
              NewOutRec->Pts = op_00;
              iVar2 = NewOutRec->Idx;
              pOVar4 = op_00;
              do {
                pOVar4->Idx = iVar2;
                pOVar4 = pOVar4->Prev;
              } while (pOVar4 != op_00);
              pOVar4 = OldOutRec->Pts;
              pOVar6 = op_00;
              bVar8 = unaff_R12B;
              do {
                iVar2 = PointInPolygon(&pOVar6->Pt,pOVar4);
                unaff_R12B = iVar2 != 0;
                if (iVar2 < 0) {
                  pOVar6 = pOVar6->Next;
                  unaff_R12B = bVar8;
                }
                if (-1 < iVar2) {
                  pOVar6 = pOVar4;
                  if ((unaff_R12B & 1) == 0) goto LAB_0010dca0;
                  break;
                }
                bVar8 = unaff_R12B;
              } while (pOVar6 != op_00);
              NewOutRec->IsHole = (bool)(OldOutRec->IsHole ^ 1);
              NewOutRec->FirstLeft = OldOutRec;
              OuterOutRec = OldOutRec;
              op_00 = pOVar7;
              if (this->m_UsingPolyTree != true) goto LAB_0010dd07;
              goto LAB_0010dcff;
            }
            goto LAB_0010dd07;
          }
          pOVar7 = pOVar7->Next;
        } while (pOVar7 != OldOutRec->Pts);
      }
      uVar5 = uVar5 + 1;
      lVar3 = *(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]);
    } while (uVar5 < (ulong)(*(long *)(this->_vptr_Clipper[-3] +
                                      (long)&(this->m_Maxima).
                                             super__List_base<long_long,_std::allocator<long_long>_>
                                      ) - lVar3 >> 3));
  }
  return;
  while (pOVar6 != pOVar4) {
LAB_0010dca0:
    iVar2 = PointInPolygon(&pOVar6->Pt,op_00);
    bVar8 = iVar2 != 0;
    if (iVar2 < 0) {
      pOVar6 = pOVar6->Next;
      bVar8 = unaff_R12B;
    }
    unaff_R12B = bVar8;
    if (-1 < iVar2) {
      if ((unaff_R12B & 1) == 0) {
        NewOutRec->IsHole = OldOutRec->IsHole;
        NewOutRec->FirstLeft = OldOutRec->FirstLeft;
        op_00 = pOVar7;
        if (this->m_UsingPolyTree == true) {
          FixupFirstLefts1(this,OldOutRec,NewOutRec);
        }
        goto LAB_0010dd07;
      }
      break;
    }
  }
  bVar1 = OldOutRec->IsHole;
  NewOutRec->IsHole = bVar1;
  OldOutRec->IsHole = (bool)(bVar1 ^ 1);
  NewOutRec->FirstLeft = OldOutRec->FirstLeft;
  OldOutRec->FirstLeft = NewOutRec;
  OuterOutRec = NewOutRec;
  NewOutRec = OldOutRec;
  op_00 = pOVar7;
  if (this->m_UsingPolyTree == true) {
LAB_0010dcff:
    FixupFirstLefts2(this,NewOutRec,OuterOutRec);
    op_00 = pOVar7;
  }
LAB_0010dd07:
  op_00 = op_00->Next;
  goto LAB_0010dbc1;
}

Assistant:

void Clipper::DoSimplePolygons()
{
  PolyOutList::size_type i = 0;
  while (i < m_PolyOuts.size()) 
  {
    OutRec* outrec = m_PolyOuts[i++];
    OutPt* op = outrec->Pts;
    if (!op || outrec->IsOpen) continue;
    do //for each Pt in Polygon until duplicate found do ...
    {
      OutPt* op2 = op->Next;
      while (op2 != outrec->Pts) 
      {
        if ((op->Pt == op2->Pt) && op2->Next != op && op2->Prev != op) 
        {
          //split the polygon into two ...
          OutPt* op3 = op->Prev;
          OutPt* op4 = op2->Prev;
          op->Prev = op4;
          op4->Next = op;
          op2->Prev = op3;
          op3->Next = op2;

          outrec->Pts = op;
          OutRec* outrec2 = CreateOutRec();
          outrec2->Pts = op2;
          UpdateOutPtIdxs(*outrec2);
          if (Poly2ContainsPoly1(outrec2->Pts, outrec->Pts))
          {
            //OutRec2 is contained by OutRec1 ...
            outrec2->IsHole = !outrec->IsHole;
            outrec2->FirstLeft = outrec;
            if (m_UsingPolyTree) FixupFirstLefts2(outrec2, outrec);
          }
          else
            if (Poly2ContainsPoly1(outrec->Pts, outrec2->Pts))
          {
            //OutRec1 is contained by OutRec2 ...
            outrec2->IsHole = outrec->IsHole;
            outrec->IsHole = !outrec2->IsHole;
            outrec2->FirstLeft = outrec->FirstLeft;
            outrec->FirstLeft = outrec2;
            if (m_UsingPolyTree) FixupFirstLefts2(outrec, outrec2);
            }
            else
          {
            //the 2 polygons are separate ...
            outrec2->IsHole = outrec->IsHole;
            outrec2->FirstLeft = outrec->FirstLeft;
            if (m_UsingPolyTree) FixupFirstLefts1(outrec, outrec2);
            }
          op2 = op; //ie get ready for the Next iteration
        }
        op2 = op2->Next;
      }
      op = op->Next;
    }
    while (op != outrec->Pts);
  }
}